

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh.h
# Opt level: O0

void __thiscall
BvhNode::BvhNode(BvhNode *this,vector<Hitable_*,_std::allocator<Hitable_*>_> *hitable_vec,double t0,
                double t1)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  Hitable **list_00;
  const_reference ppHVar4;
  ulong local_40;
  size_t i;
  Hitable **list;
  size_type n;
  double t1_local;
  double t0_local;
  vector<Hitable_*,_std::allocator<Hitable_*>_> *hitable_vec_local;
  BvhNode *this_local;
  
  Hitable::Hitable(&this->super_Hitable);
  (this->super_Hitable)._vptr_Hitable = (_func_int **)&PTR_Hit_00144c50;
  AABB::AABB(&this->box_);
  sVar2 = std::vector<Hitable_*,_std::allocator<Hitable_*>_>::size(hitable_vec);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  list_00 = (Hitable **)operator_new__(uVar3);
  for (local_40 = 0; local_40 < sVar2; local_40 = local_40 + 1) {
    ppHVar4 = std::vector<Hitable_*,_std::allocator<Hitable_*>_>::operator[](hitable_vec,local_40);
    list_00[local_40] = *ppHVar4;
  }
  Build(this,list_00,(int)sVar2,t0,t1);
  return;
}

Assistant:

BvhNode::BvhNode(const std::vector<Hitable*> hitable_vec, double t0, double t1) {
  auto n = hitable_vec.size();
  Hitable** list = new Hitable*[n + 1];
  for (size_t i = 0; i < n; i++) {
    list[i] = hitable_vec[i];
  }
  Build(list, n, t0, t1);
}